

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Test::Impl::Impl_Suite::WhenRunner::run<__6&>
          (WhenRunner *this,anon_class_1_0_00000001_for_runTest *functor)

{
  Stats rhs;
  bool bVar1;
  reference pvVar2;
  uint64_t uVar3;
  bool local_c1;
  Stats local_b0;
  exception *e;
  WhenRunner *local_70;
  undefined1 local_68 [8];
  Check check;
  StackElement *element;
  iterator __end4;
  iterator __begin4;
  vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
  *__range4;
  anon_class_1_0_00000001_for_runTest *functor_local;
  WhenRunner *this_local;
  
  std::
  vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
  ::clear(&this->whenStack);
  this->whenDepth_ = 0;
  Impl_Results::Stats::addFixture(&this->stats_);
  do {
    __end4 = std::
             vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ::begin(&this->whenStack);
    element = (StackElement *)
              std::
              vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
              ::end(&this->whenStack);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4,(__normal_iterator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement_*,_std::vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>_>
                                  *)&element);
      if (!bVar1) break;
      check.stats_.failedChecks_ =
           (uint64_t)
           __gnu_cxx::
           __normal_iterator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement_*,_std::vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>_>
           ::operator*(&__end4);
      ((reference)check.stats_.failedChecks_)->current = 0;
      __gnu_cxx::
      __normal_iterator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement_*,_std::vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>_>
      ::operator++(&__end4);
    }
    local_70 = (WhenRunner *)
               Enhedron::Impl::Util::out<Enhedron::Test::Impl::Impl_Suite::WhenRunner>(this);
    Check::Check((Check *)local_68,(Out<Enhedron::Test::Impl::Impl_Suite::WhenRunner>)local_70);
    $_6::operator()((__6 *)functor,(Check *)local_68);
    Impl_Results::Stats::addTest(&this->stats_);
    while( true ) {
      bVar1 = std::
              vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
              ::empty(&this->whenStack);
      local_c1 = false;
      if (!bVar1) {
        local_c1 = topWhenDone(this);
      }
      if (local_c1 == false) break;
      std::
      vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ::pop_back(&this->whenStack);
    }
    bVar1 = std::
            vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ::empty(&this->whenStack);
    if (!bVar1) {
      pvVar2 = std::
               vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ::back(&this->whenStack);
      pvVar2->index = pvVar2->index + 1;
    }
    checkStats(&local_b0,(Check *)local_68);
    rhs.tests_ = local_b0.tests_;
    rhs.fixtures_ = local_b0.fixtures_;
    rhs.checks_ = local_b0.checks_;
    rhs.failedTests_ = local_b0.failedTests_;
    rhs.failedChecks_ = local_b0.failedChecks_;
    Impl_Results::Stats::operator+=(&this->stats_,rhs);
    bVar1 = std::
            vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ::empty(&this->whenStack);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  uVar3 = Impl_Results::Stats::tests(&this->stats_);
  if (uVar3 == 0) {
    Impl_Results::Stats::addTest(&this->stats_);
  }
  return;
}

Assistant:

void WhenRunner::run(Functor&& functor, Args&&... args) {
        whenStack.clear();
        whenDepth_ = 0;
        stats_.addFixture(); // TODO:

        do {
            for (auto& element : whenStack) {
                element.current = 0;
            }

            Check check(out(*this));

            try {
                functor(check, forward<Args>(args)...);
            }
            catch (const exception& e) {
                whenResultRecorder_.failByException(e);
                stats_.failTest();
            }

            stats_.addTest(); // TODO

            while ( ! whenStack.empty() && topWhenDone()) {
                whenStack.pop_back();
            }

            if ( ! whenStack.empty()) {
                ++whenStack.back().index;
            }

            stats_ += checkStats(check);
        } while ( ! whenStack.empty());

        if (stats_.tests() == 0) {
            stats_.addTest();
        }
    }